

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

void cvui::render::trackbarSteps
               (cvui_block_t *theBlock,int theState,Rect *theShape,double theValue,
               TrackbarParams *theParams,Rect *theWorkingArea)

{
  double dVar1;
  int iVar2;
  longdouble lVar3;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  longdouble local_9c;
  double local_90;
  double local_88;
  longdouble local_7c;
  undefined4 local_70 [2];
  cvui_block_t *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar2 = theWorkingArea->height / 2 + theWorkingArea->y;
  local_58 = 0x4054400000000000;
  uStack_50 = 0x4054400000000000;
  local_48 = 0x4054400000000000;
  uStack_40 = 0;
  local_9c = *(longdouble *)theParams;
  if (((byte)theParams[0x34] & 4) == 0) {
    lVar3 = *(longdouble *)(theParams + 0x10);
    local_7c = (lVar3 - local_9c) / (longdouble)20.0;
  }
  else {
    local_7c = *(longdouble *)(theParams + 0x20);
    lVar3 = *(longdouble *)(theParams + 0x10);
  }
  if (local_9c <= lVar3) {
    do {
      local_88 = (double)((local_9c - *(longdouble *)theParams) / (lVar3 - *(longdouble *)theParams)
                         );
      dVar1 = 1.0;
      if (local_88 <= 1.0) {
        dVar1 = local_88;
      }
      local_90 = 0.0;
      if (0.0 <= dVar1) {
        local_90 = dVar1;
      }
      local_ac = (int)ROUND(local_90 * (double)(theShape->width + -0x1c) +
                            (double)theShape->x + 14.0);
      local_60 = 0;
      local_70[0] = 0x3010000;
      local_a8 = iVar2 + -3;
      local_a4 = local_ac;
      local_a0 = iVar2;
      local_68 = theBlock;
      cv::line(local_70,&local_a4,&local_ac,&local_58,1,8,0);
      local_9c = local_9c + local_7c;
      lVar3 = *(longdouble *)(theParams + 0x10);
    } while (local_9c <= lVar3);
  }
  return;
}

Assistant:

void trackbarSteps(cvui_block_t& theBlock, int theState, cv::Rect& theShape, double theValue, const internal::TrackbarParams &theParams, cv::Rect& theWorkingArea) {
		cv::Point aBarTopLeft(theWorkingArea.x, theWorkingArea.y + theWorkingArea.height / 2);
		cv::Scalar aColor(0x51, 0x51, 0x51);

		bool aDiscrete = internal::bitsetHas(theParams.options, cvui::TRACKBAR_DISCRETE);
		long double aFixedStep = aDiscrete ? theParams.step : (theParams.max - theParams.min) / 20;

		// TODO: check min, max and step to prevent infinite loop.
		for (long double aValue = theParams.min; aValue <= theParams.max; aValue += aFixedStep) {
			int aPixelX = internal::trackbarValueToXPixel(theParams, theShape, aValue);
			cv::Point aPoint1(aPixelX, aBarTopLeft.y);
			cv::Point aPoint2(aPixelX, aBarTopLeft.y - 3);
			cv::line(theBlock.where, aPoint1, aPoint2, aColor);
		}
	}